

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int lookup(hash_table_t *table,hash_key_t key,hash_entry_t **entry)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  ulong *in_RDI;
  hash_entry_t *cur;
  hash_hashvalue_t hashval;
  size_t startindex;
  size_t index;
  ulong local_28;
  
  iVar2 = (*(code *)in_RDI[2])(in_RSI);
  uVar1 = *in_RDI;
  local_28 = (ulong)(long)iVar2 % uVar1;
  do {
    puVar4 = (undefined8 *)(in_RDI[4] + local_28 * 0x30);
    if (((*(int *)(puVar4 + 5) == 2) && (*(int *)(puVar4 + 2) == iVar2)) &&
       (iVar3 = (*(code *)in_RDI[3])(*puVar4,in_RSI), iVar3 == 0)) {
      *in_RDX = puVar4;
      return 0;
    }
    if (*(int *)(puVar4 + 5) == 0) {
      return -1;
    }
    local_28 = local_28 + 1;
    if (local_28 == *in_RDI) {
      local_28 = 0;
    }
  } while (local_28 != (ulong)(long)iVar2 % uVar1);
  return -1;
}

Assistant:

static int lookup(hash_table_t *table, hash_key_t key, hash_entry_t **entry)
{
   size_t index, startindex;
   hash_hashvalue_t hashval;

   hashval = table->hashfunc(key);
   index = hashval % table->table_size;
   startindex = index;
   
   for (;;) {
      hash_entry_t *cur = table->table + index;
      if ((cur->status == INUSE) && 
          (cur->hash_value == hashval) && 
          (table->keycmp(cur->key, key) == 0)) {
         *entry = cur;
         return 0;
      }

      if (cur->status == EMPTY)
         return -1;
      index++;
      if (index == table->table_size)
         index = 0;
      if (index == startindex)
         return -1;
   }
}